

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

void __thiscall mkvmuxer::Tags::~Tags(Tags *this)

{
  int iVar1;
  
  iVar1 = this->tags_count_;
  while (0 < iVar1) {
    this->tags_count_ = iVar1 - 1U;
    Tag::Clear(this->tags_ + (iVar1 - 1U));
    iVar1 = this->tags_count_;
  }
  if (this->tags_ != (Tag *)0x0) {
    operator_delete__(&this->tags_[-1].simple_tags_size_);
  }
  this->tags_ = (Tag *)0x0;
  return;
}

Assistant:

Tags::~Tags() {
  while (tags_count_ > 0) {
    Tag& tag = tags_[--tags_count_];
    tag.Clear();
  }

  delete[] tags_;
  tags_ = NULL;
}